

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionAlgorithmsBullet.cpp
# Opt level: O3

int chrono::collision::addContactPoint
              (cbtVector3 *pc,int iface,cbtVector3 *hdims,cbtTransform *X_box,
              cbtManifoldResult *resultOut)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  cbtScalar cVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  cbtVector3 p;
  cbtVector3 point;
  cbtVector3 normal;
  undefined1 local_68 [8];
  uint uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  if ((iface != 0) && (iface + 3U < 7)) {
    bVar8 = bt_utils::PointInsideBox(hdims,pc);
    iVar9 = 0;
    if (bVar8) {
      local_58 = *(undefined8 *)pc->m_floats;
      uStack_50 = *(undefined8 *)(pc->m_floats + 2);
      _local_68 = ZEXT816(0) << 0x20;
      if (iface < 1) {
        lVar10 = (long)~iface;
        fVar1 = hdims->m_floats[lVar10];
        *(undefined4 *)(local_68 + lVar10 * 4) = 0xbf800000;
        *(float *)((long)&local_58 + lVar10 * 4) = -fVar1;
        cVar12 = -pc->m_floats[lVar10];
      }
      else {
        uVar11 = (ulong)(iface - 1);
        fVar1 = hdims->m_floats[uVar11];
        *(undefined4 *)(local_68 + uVar11 * 4) = 0x3f800000;
        *(float *)((long)&local_58 + uVar11 * 4) = fVar1;
        cVar12 = pc->m_floats[uVar11];
      }
      fVar2 = (X_box->m_basis).m_el[0].m_floats[1];
      fVar3 = (X_box->m_basis).m_el[1].m_floats[1];
      fVar4 = (X_box->m_basis).m_el[2].m_floats[1];
      auVar13 = ZEXT416((uint)(X_box->m_basis).m_el[0].m_floats[0]);
      auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * (float)local_68._4_4_)),auVar13,
                               ZEXT416((uint)local_68._0_4_));
      auVar15 = ZEXT416((uint)(X_box->m_basis).m_el[1].m_floats[0]);
      auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * (float)local_68._4_4_)),auVar15,
                               ZEXT416((uint)local_68._0_4_));
      auVar18 = ZEXT416((uint)(X_box->m_basis).m_el[2].m_floats[0]);
      auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * (float)local_68._4_4_)),auVar18,
                               ZEXT416((uint)local_68._0_4_));
      auVar14 = ZEXT416((uint)(X_box->m_basis).m_el[0].m_floats[2]);
      auVar5 = vfmadd231ss_fma(auVar5,auVar14,ZEXT416(uStack_60));
      auVar16 = ZEXT416((uint)(X_box->m_basis).m_el[1].m_floats[2]);
      auVar6 = vfmadd231ss_fma(auVar6,auVar16,ZEXT416(uStack_60));
      auVar17 = ZEXT416((uint)(X_box->m_basis).m_el[2].m_floats[2]);
      auVar7 = vfmadd231ss_fma(auVar7,auVar17,ZEXT416(uStack_60));
      auVar5 = vinsertps_avx(auVar5,auVar6,0x10);
      local_38 = vinsertps_avx(auVar5,auVar7,0x28);
      auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * local_58._4_4_)),ZEXT416((uint)local_58),
                               auVar13);
      auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * local_58._4_4_)),ZEXT416((uint)local_58),
                               auVar15);
      auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * local_58._4_4_)),ZEXT416((uint)local_58),
                               auVar18);
      auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)uStack_50),auVar14);
      auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)uStack_50),auVar16);
      auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)uStack_50),auVar17);
      auVar5 = vinsertps_avx(ZEXT416((uint)(auVar5._0_4_ + (X_box->m_origin).m_floats[0])),
                             ZEXT416((uint)(auVar6._0_4_ + (X_box->m_origin).m_floats[1])),0x10);
      local_48 = vinsertps_avx(auVar5,ZEXT416((uint)(auVar7._0_4_ + (X_box->m_origin).m_floats[2])),
                               0x28);
      (*(resultOut->super_Result)._vptr_Result[4])((ulong)(uint)(cVar12 - fVar1),resultOut);
      iVar9 = 1;
    }
    return iVar9;
  }
  __assert_fail("iface >= -3 && iface <= +3 && iface != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/ChCollisionAlgorithmsBullet.cpp"
                ,0xfc,
                "int chrono::collision::addContactPoint(const cbtVector3 &, int, const cbtVector3 &, const cbtTransform &, cbtManifoldResult *)"
               );
}

Assistant:

int addContactPoint(const cbtVector3& pc,
                    int iface,
                    const cbtVector3& hdims,
                    const cbtTransform& X_box,
                    cbtManifoldResult* resultOut) {
    assert(iface >= -3 && iface <= +3 && iface != 0);

    // No contact if point outside box
    if (!bt_utils::PointInsideBox(hdims, pc))
        return 0;  // no contacts added

    // Find point projection on box face and calculate normal and penetration
    // (still working in the box frame)
    cbtVector3 p = pc;
    cbtVector3 n(0, 0, 0);
    cbtScalar penetration;
    if (iface > 0) {
        // "positive" box face
        int i = iface - 1;
        p[i] = hdims[i];
        n[i] = 1;
        penetration = pc[i] - hdims[i];
    } else {
        // "negative" box face
        int i = -iface - 1;
        p[i] = -hdims[i];
        n[i] = -1;
        penetration = -pc[i] - hdims[i];
    }

    // A new contact point must specify (in absolute frame):
    //   normal, pointing from B towards A
    //   point, located on surface of B
    //   distance, negative for penetration
    cbtVector3 normal = X_box.getBasis() * n;
    cbtVector3 point = X_box(p);
    resultOut->addContactPoint(normal, point, penetration);

    ////std::cout << "add contact     nrm = " << normal.x() << " " << normal.y() << " " << normal.z() << std::endl;
    ////std::cout << "                pnt = " << point.x() << " " << point.y() << " " << point.z() << std::endl;
    ////std::cout << "                pen = " << penetration << std::endl;

    return 1;  // one contact added
}